

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualMulti.cpp
# Opt level: O3

void __thiscall HEkkDual::minorUpdateDual(HEkkDual *this)

{
  double *pdVar1;
  int iVar2;
  pointer ppVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  double dVar7;
  
  dVar7 = this->theta_dual;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    HEkkDualRow::updateDual(&this->dualRow,dVar7);
    if ((this->slice_PRICE != 0) && (0 < this->slice_num)) {
      lVar4 = 0;
      lVar6 = 0;
      do {
        HEkkDualRow::updateDual
                  ((HEkkDualRow *)
                   ((long)&((this->slice_dualRow).
                            super__Vector_base<HEkkDualRow,_std::allocator<HEkkDualRow>_>._M_impl.
                            super__Vector_impl_data._M_start)->ekk_instance_ + lVar4),
                   this->theta_dual);
        lVar6 = lVar6 + 1;
        lVar4 = lVar4 + 0x150;
      } while (lVar6 < this->slice_num);
    }
  }
  else {
    shiftCost(this,this->variable_in,-this->workDual[this->variable_in]);
  }
  pdVar1 = this->workDual;
  pdVar1[this->variable_in] = 0.0;
  iVar2 = this->variable_out;
  pdVar1[iVar2] = -this->theta_dual;
  shiftBack(this,iVar2);
  HEkkDualRow::updateFlip(&this->dualRow,this->multi_finish[this->multi_nFinish].col_BFRT);
  iVar2 = this->multi_num;
  if (0 < iVar2) {
    uVar5 = 0;
    do {
      if (((uVar5 == (uint)this->multi_iChoice) || (-1 < this->multi_choice[uVar5].row_out)) &&
         (0 < (this->dualRow).workCount)) {
        ppVar3 = (this->dualRow).workData.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar4 = 0;
        lVar6 = 0;
        do {
          dVar7 = HighsSparseMatrix::computeDot
                            (this->a_matrix,&this->multi_choice[uVar5].row_ep.array,
                             *(HighsInt *)((long)&ppVar3->first + lVar4));
          ppVar3 = (this->dualRow).workData.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          this->multi_choice[uVar5].baseValue =
               this->multi_choice[uVar5].baseValue -
               dVar7 * *(double *)((long)&ppVar3->second + lVar4);
          lVar6 = lVar6 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar6 < (this->dualRow).workCount);
        iVar2 = this->multi_num;
      }
      uVar5 = uVar5 + 1;
    } while ((long)uVar5 < (long)iVar2);
  }
  return;
}

Assistant:

void HEkkDual::minorUpdateDual() {
  /**
   * 1. Update the dual solution
   *    XXX Data parallel (depends on the ap partition before)
   */
  if (theta_dual == 0) {
    shiftCost(variable_in, -workDual[variable_in]);
  } else {
    dualRow.updateDual(theta_dual);
    if (slice_PRICE) {
      for (HighsInt i = 0; i < slice_num; i++)
        slice_dualRow[i].updateDual(theta_dual);
    }
  }
  workDual[variable_in] = 0;
  workDual[variable_out] = -theta_dual;
  shiftBack(variable_out);

  /**
   * 2. Apply global bound flip
   */
  dualRow.updateFlip(multi_finish[multi_nFinish].col_BFRT);

  /**
   * 3. Apply local bound flips
   */
  for (HighsInt ich = 0; ich < multi_num; ich++) {
    if (ich == multi_iChoice || multi_choice[ich].row_out >= 0) {
      HVector* this_ep = &multi_choice[ich].row_ep;
      for (HighsInt i = 0; i < dualRow.workCount; i++) {
        double dot = a_matrix->computeDot(*this_ep, dualRow.workData[i].first);
        multi_choice[ich].baseValue -= dualRow.workData[i].second * dot;
      }
    }
  }
}